

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O3

bool __thiscall
squall::TableBase::get<std::__cxx11::string>
          (TableBase *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r)

{
  HSQUIRRELVM vm;
  char *pcVar1;
  SQRESULT SVar2;
  HSQOBJECT obj;
  char *r_1;
  char *local_30;
  
  obj._4_4_ = 0;
  obj._type = (this->tableobj_)._type;
  obj._unVal.pTable = (this->tableobj_)._unVal.pTable;
  sq_pushobject(this->vm_,obj);
  sq_pushstring(this->vm_,(name->_M_dataplus)._M_p,name->_M_string_length);
  SVar2 = sq_get(this->vm_,-2);
  if (-1 < SVar2) {
    vm = this->vm_;
    detail::check_argument_type<(squall::detail::FetchContext)2>(vm,-1,OT_STRING);
    sq_getstring(vm,-1,&local_30);
    pcVar1 = (char *)r->_M_string_length;
    strlen(local_30);
    std::__cxx11::string::_M_replace((ulong)r,0,pcVar1,(ulong)local_30);
    sq_pop(this->vm_,2);
  }
  return -1 < SVar2;
}

Assistant:

bool get(const string& name, T& r) {
        sq_pushobject(vm_, tableobj_);
        sq_pushstring(vm_, name.data(), name.length());
        if (!SQ_SUCCEEDED(sq_get(vm_, -2))) {
            return false;
        }
        r = detail::fetch<T, detail::FetchContext::TableEntry>(vm_, -1);
        sq_pop(vm_, 2);
        return true;
    }